

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<int>::emplace<int&>(QPodArrayOps<int> *this,qsizetype i,int *args)

{
  bool bVar1;
  qsizetype qVar2;
  int *piVar3;
  int *in_RDX;
  QArrayDataPointer<int> *in_RSI;
  long in_RDI;
  int *where;
  GrowthPosition pos;
  int tmp;
  bool detach;
  QArrayDataPointer<int> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar6;
  
  bVar1 = QArrayDataPointer<int>::needsDetach(in_stack_ffffffffffffffd0);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
  if (!bVar1) {
    if ((in_RSI == *(QArrayDataPointer<int> **)(in_RDI + 0x10)) &&
       (qVar2 = QArrayDataPointer<int>::freeSpaceAtEnd
                          ((QArrayDataPointer<int> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      piVar3 = QArrayDataPointer<int>::end(in_stack_ffffffffffffffd0);
      *piVar3 = *in_RDX;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<int> *)0x0) &&
       (qVar2 = QArrayDataPointer<int>::freeSpaceAtBegin
                          ((QArrayDataPointer<int> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      piVar3 = QArrayDataPointer<int>::begin((QArrayDataPointer<int> *)0x4750be);
      piVar3[-1] = *in_RDX;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -4;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
  }
  iVar5 = *in_RDX;
  uVar4 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<int> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<int>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar6,iVar5),
             (int **)CONCAT44(uVar4,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  piVar3 = createHole((QPodArrayOps<int> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar6,iVar5),CONCAT44(uVar4,in_stack_ffffffffffffffd8));
  *piVar3 = iVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }